

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_stroke_rect(nk_command_buffer *b,nk_rect rect,float rounding,float line_thickness,nk_color c
                   )

{
  float fVar1;
  void *pvVar2;
  float fVar3;
  float fVar12;
  undefined1 auVar4 [12];
  undefined1 auVar5 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar14;
  float fVar16;
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar13;
  
  if (b == (nk_command_buffer *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x2246,
                  "void nk_stroke_rect(struct nk_command_buffer *, struct nk_rect, float, float, struct nk_color)"
                 );
  }
  if ((0.0 < line_thickness) && (0xffffff < (uint)c)) {
    fVar14 = rect.w;
    if ((fVar14 != 0.0) || (NAN(fVar14))) {
      fVar16 = rect.h;
      if ((fVar16 != 0.0) || (NAN(fVar16))) {
        fVar3 = rect.x;
        fVar12 = rect.y;
        if (b->use_clipping != 0) {
          fVar1 = (b->clip).x;
          if (fVar3 + fVar14 < fVar1) {
            return;
          }
          if (fVar1 + (b->clip).w < fVar3) {
            return;
          }
          fVar14 = (b->clip).y;
          if (fVar16 + fVar12 < fVar14) {
            return;
          }
          if (fVar14 + (b->clip).h < fVar12) {
            return;
          }
        }
        pvVar2 = nk_command_buffer_push(b,NK_COMMAND_RECT,0x20);
        auVar17._8_8_ = rect._8_8_;
        auVar17._0_8_ = rect._8_8_;
        if (pvVar2 != (void *)0x0) {
          auVar5._0_4_ = (int)rounding;
          iVar13 = (int)line_thickness;
          auVar4._0_8_ = CONCAT44(iVar13,auVar5._0_4_);
          auVar4._8_4_ = (int)fVar3;
          auVar15._12_4_ = (int)fVar12;
          auVar15._0_12_ = auVar4;
          auVar15 = packssdw(auVar15,auVar15);
          auVar8._12_2_ = (short)((uint)iVar13 >> 0x10);
          auVar8._0_12_ = auVar4;
          auVar8._14_2_ = auVar15._6_2_;
          auVar7._12_4_ = auVar8._12_4_;
          auVar7._0_10_ = auVar4._0_10_;
          auVar7._10_2_ = auVar15._4_2_;
          auVar6._10_6_ = auVar7._10_6_;
          auVar6._8_2_ = (short)iVar13;
          auVar6._0_8_ = auVar4._0_8_;
          auVar5._8_8_ = auVar6._8_8_;
          auVar5._6_2_ = auVar15._2_2_;
          auVar5._4_2_ = (short)((uint)auVar5._0_4_ >> 0x10);
          auVar9._0_2_ = (undefined2)auVar5._0_4_;
          auVar9._2_2_ = auVar15._0_2_;
          auVar9._8_4_ = auVar6._8_4_;
          auVar9._4_4_ = auVar7._12_4_;
          auVar9._12_4_ = auVar5._4_4_;
          auVar15 = pshuflw(auVar9,auVar9,0xec);
          auVar10._0_4_ = auVar15._0_4_;
          auVar10._8_4_ = auVar15._8_4_;
          auVar10._12_4_ = auVar15._12_4_;
          auVar10._4_4_ = auVar10._8_4_;
          auVar15 = pshuflw(auVar10,auVar10,0x78);
          *(long *)((long)pvVar2 + 0x10) = auVar15._0_8_;
          auVar17 = maxps(auVar17,(undefined1  [16])0x0);
          auVar11._0_4_ = (int)auVar17._0_4_;
          auVar11._4_4_ = (int)auVar17._4_4_;
          auVar11._8_4_ = (int)auVar17._8_4_;
          auVar11._12_4_ = (int)auVar17._12_4_;
          auVar17 = pshuflw(auVar11,auVar11,0xe8);
          *(int *)((long)pvVar2 + 0x18) = auVar17._0_4_;
          *(short *)((long)pvVar2 + 0x1c) = c._0_2_;
          *(nk_byte *)((long)pvVar2 + 0x1e) = c.b;
          *(nk_byte *)((long)pvVar2 + 0x1f) = c.a;
        }
      }
    }
  }
  return;
}

Assistant:

NK_API void
nk_stroke_rect(struct nk_command_buffer *b, struct nk_rect rect,
    float rounding, float line_thickness, struct nk_color c)
{
    struct nk_command_rect *cmd;
    NK_ASSERT(b);
    if (!b || c.a == 0 || rect.w == 0 || rect.h == 0 || line_thickness <= 0) return;
    if (b->use_clipping) {
        const struct nk_rect *clip = &b->clip;
        if (!NK_INTERSECT(rect.x, rect.y, rect.w, rect.h,
            clip->x, clip->y, clip->w, clip->h)) return;
    }
    cmd = (struct nk_command_rect*)
        nk_command_buffer_push(b, NK_COMMAND_RECT, sizeof(*cmd));
    if (!cmd) return;
    cmd->rounding = (unsigned short)rounding;
    cmd->line_thickness = (unsigned short)line_thickness;
    cmd->x = (short)rect.x;
    cmd->y = (short)rect.y;
    cmd->w = (unsigned short)NK_MAX(0, rect.w);
    cmd->h = (unsigned short)NK_MAX(0, rect.h);
    cmd->color = c;
}